

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O2

int __thiscall llbuild::ninja::Lexer::getNextChar(Lexer *this)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  
  pcVar3 = this->bufferPos;
  pcVar5 = (this->buffer).Data + (this->buffer).Length;
  if (pcVar3 == pcVar5) {
    iVar4 = -1;
  }
  else {
    pcVar1 = pcVar3 + 1;
    this->bufferPos = pcVar1;
    cVar2 = *pcVar3;
    if ((cVar2 != '\r') && (cVar2 != '\n')) {
      this->columnNumber = this->columnNumber + 1;
      return (int)cVar2;
    }
    if ((pcVar1 != pcVar5) && (*pcVar1 == (char)('\x17' - cVar2))) {
      this->bufferPos = pcVar3 + 2;
    }
    this->lineNumber = this->lineNumber + 1;
    this->columnNumber = 0;
    iVar4 = 10;
  }
  return iVar4;
}

Assistant:

iterator end() const { return Data + Length; }